

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
GraphTestCycleWithLengthZeroFromDepfile::Run(GraphTestCycleWithLengthZeroFromDepfile *this)

{
  Edge *pEVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule deprule\n   depfile = dep.d\n   command = unused\nbuild a b: deprule\n",
              (ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dep.d",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"a: b\n",&local_59);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pTVar2 = g_current_test;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"a",&local_5a);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
  bVar3 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,pNVar4,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,&local_38);
  testing::Test::Check
            (pTVar2,!bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x1b2,"scan_.RecomputeDirty(GetNode(\"a\"), NULL, &err)");
  std::__cxx11::string::~string((string *)&local_58);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("dependency cycle: b -> b",&local_38);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x1b3,"\"dependency cycle: b -> b\" == err");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"a",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    pEVar1 = pNVar4->in_edge_;
    std::__cxx11::string::~string((string *)&local_58);
    testing::Test::Check
              (g_current_test,
               (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start == 8,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1b9,"1 == edge->inputs_.size()");
    pTVar2 = g_current_test;
    bVar3 = std::operator==("b",&(*(pEVar1->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->path_);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1ba,"\"b\" == edge->inputs_[0]->path()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TEST_F(GraphTest, CycleWithLengthZeroFromDepfile) {
  AssertParse(&state_,
"rule deprule\n"
"   depfile = dep.d\n"
"   command = unused\n"
"build a b: deprule\n"
  );
  fs_.Create("dep.d", "a: b\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), NULL, &err));
  ASSERT_EQ("dependency cycle: b -> b", err);

  // Despite the depfile causing edge to be a cycle (it has outputs a and b,
  // but the depfile also adds b as an input), the deps should have been loaded
  // only once:
  Edge* edge = GetNode("a")->in_edge();
  EXPECT_EQ(1, edge->inputs_.size());
  EXPECT_EQ("b", edge->inputs_[0]->path());
}